

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O3

void crnlib::LzmaEnc_InitPrices(CLzmaEnc *p)

{
  uint uVar1;
  UInt32 UVar2;
  UInt32 posState;
  
  if (p->fastMode == 0) {
    FillDistancesPrices(p);
    FillAlignPrices(p);
  }
  UVar2 = p->numFastBytes - 1;
  (p->repLenEnc).tableSize = UVar2;
  (p->lenEnc).tableSize = UVar2;
  uVar1 = p->pb;
  UVar2 = 0;
  do {
    LenPriceEnc_UpdateTable(&p->lenEnc,UVar2,p->ProbPrices);
    UVar2 = UVar2 + 1;
  } while (1 << ((byte)uVar1 & 0x1f) != UVar2);
  uVar1 = p->pb;
  UVar2 = 0;
  do {
    LenPriceEnc_UpdateTable(&p->repLenEnc,UVar2,p->ProbPrices);
    UVar2 = UVar2 + 1;
  } while (1 << ((byte)uVar1 & 0x1f) != UVar2);
  return;
}

Assistant:

void LzmaEnc_InitPrices(CLzmaEnc* p) {
  if (!p->fastMode) {
    FillDistancesPrices(p);
    FillAlignPrices(p);
  }

  p->lenEnc.tableSize =
      p->repLenEnc.tableSize =
          p->numFastBytes + 1 - LZMA_MATCH_LEN_MIN;
  LenPriceEnc_UpdateTables(&p->lenEnc, 1 << p->pb, p->ProbPrices);
  LenPriceEnc_UpdateTables(&p->repLenEnc, 1 << p->pb, p->ProbPrices);
}